

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall AttributeCertificateInfo::SetDataSize(AttributeCertificateInfo *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  AttributeCertificateInfo *this_local;
  
  sVar1 = DerBase::EncodedSize(&(this->version).super_DerBase);
  sVar2 = DerBase::EncodedSize(&(this->holder).super_DerBase);
  sVar3 = DerBase::EncodedSize(&(this->issuer).super_DerBase);
  sVar4 = DerBase::EncodedSize(&(this->signature).super_DerBase);
  sVar5 = DerBase::EncodedSize(&(this->serialNumber).super_DerBase);
  sVar6 = DerBase::EncodedSize(&(this->attrCertValidityPeriod).super_DerBase);
  sVar7 = DerBase::EncodedSize(&(this->issuerUniqueID).super_DerBase);
  sVar8 = GetEncodedSize<Attribute>(&this->attributes);
  sVar9 = DerBase::EncodedSize(&(this->extensions).super_DerBase);
  (this->super_DerBase).cbData =
       sVar1 + sVar2 + sVar3 + sVar4 + sVar5 + sVar6 + sVar7 + sVar8 + sVar9;
  return (this->super_DerBase).cbData;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData =
			version.EncodedSize() +
			holder.EncodedSize() +
			issuer.EncodedSize() +
			signature.EncodedSize() +
			serialNumber.EncodedSize() +
			attrCertValidityPeriod.EncodedSize() +
			issuerUniqueID.EncodedSize() +
			GetEncodedSize(attributes) +
			extensions.EncodedSize();

		return cbData;
	}